

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O1

Index __thiscall
MADPComponentDiscreteStates::GetStateIndexByName(MADPComponentDiscreteStates *this,string *s)

{
  pointer pSVar1;
  pointer pcVar2;
  size_t __n;
  int iVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  E *this_00;
  Index unaff_EBP;
  pointer pSVar6;
  bool bVar7;
  stringstream ss;
  long *local_1b8;
  size_t local_1b0;
  long local_1a8 [47];
  
  if (this->_m_initialized == false) {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,"MADPComponentDiscreteStates::GetStateIndexByName - not initialized!");
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  pSVar6 = (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pSVar6 == pSVar1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"GetStateIndexByName - state \"",0x1d);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(s->_M_dataplus)._M_p,s->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" not found.",0xc);
      std::endl<char,std::char_traits<char>>(poVar4);
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
      *puVar5 = &PTR__E_0059bd80;
      std::__cxx11::stringbuf::str();
      __cxa_throw(puVar5,&E::typeinfo,E::~E);
    }
    pcVar2 = (pSVar6->super_State).super_NamedDescribedEntity._m_name._M_dataplus._M_p;
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar2,
               pcVar2 + (pSVar6->super_State).super_NamedDescribedEntity._m_name._M_string_length);
    __n = s->_M_string_length;
    if (__n == local_1b0) {
      if (__n == 0) {
        bVar7 = true;
      }
      else {
        iVar3 = bcmp((s->_M_dataplus)._M_p,local_1b8,__n);
        bVar7 = iVar3 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    if (bVar7) {
      unaff_EBP = (pSVar6->super_DiscreteEntity)._m_index;
    }
    else {
      pSVar6 = pSVar6 + 1;
    }
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
  } while (!bVar7);
  return unaff_EBP;
}

Assistant:

Index MADPComponentDiscreteStates::GetStateIndexByName(const string &s) const
{
    if(!_m_initialized)
        throw E("MADPComponentDiscreteStates::GetStateIndexByName - not initialized!");

    vector<StateDiscrete>::const_iterator it = _m_stateVec.begin();
    vector<StateDiscrete>::const_iterator last = _m_stateVec.end();
    while(it != last)
    {
        string s2 = (*it).GetName();
        if(s == s2)
        //if(strcmp(s,s2) == 0)//match
            return( (*it).GetIndex() );
        it++;
    }
    //not found
    //return(-1);
    stringstream ss;
    ss << "GetStateIndexByName - state \"" << s << "\" not found." << endl;
    throw E(ss);

}